

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

size_type __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  size_type sVar4;
  iterator local_30;
  
  find<int>(&local_30,this,key);
  piVar3 = local_30.pos;
  local_30.pos = this->table + this->num_buckets;
  local_30.ht = this;
  local_30.end = local_30.pos;
  dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_30);
  if (piVar3 == local_30.pos) {
    sVar4 = 0;
  }
  else {
    sVar4 = this->num_deleted;
    iVar2 = (this->key_info).delkey;
    if (sVar4 != 0) {
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
    }
    *piVar3 = iVar2;
    this->num_deleted = sVar4 + 1;
    (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         true;
    sVar4 = 1;
  }
  return sVar4;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not trying to erase delkey or emptyval.
    assert(
        (!settings.use_empty() || !equals(key, key_info.empty_key)) &&
        "Erasing the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      settings.set_consider_shrink(
          true);  // will think about shrink after next insert
      return 1;   // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }